

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O3

size_t tinyusdz::Usd_IntegerCompression::CompressToBuffer
                 (uint32_t *ints,size_t numInts,char *compressed,string *err)

{
  mapped_type *pmVar1;
  byte *pbVar2;
  char *input;
  size_t sVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  int iVar14;
  bool bVar15;
  SInt val;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  counts;
  int local_8c;
  string *local_88;
  ulong local_80;
  int *local_78;
  char *local_70;
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (numInts == 0) {
    input = (char *)operator_new__(0);
    sVar3 = LZ4Compression::CompressToBuffer(input,compressed,0,err);
    operator_delete__(input);
    return sVar3;
  }
  local_80 = numInts * 2 + 7 >> 3;
  local_88 = err;
  local_70 = compressed;
  local_78 = (int *)operator_new__(local_80 + numInts * 4 + 4);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  lVar12 = 0;
  iVar5 = 0;
  uVar9 = 0;
  iVar11 = 0;
  do {
    local_8c = *(int *)((long)ints + lVar12) - iVar5;
    pmVar1 = ::std::__detail::
             _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_8c);
    uVar6 = *pmVar1 + 1;
    *pmVar1 = uVar6;
    bVar15 = uVar6 == uVar9;
    iVar14 = local_8c;
    if (((uVar6 <= uVar9) && (uVar6 = uVar9, iVar14 = iVar11, bVar15)) && (iVar11 < local_8c)) {
      iVar14 = local_8c;
    }
    iVar5 = *(int *)((long)ints + lVar12);
    lVar12 = lVar12 + 4;
    uVar9 = uVar6;
    iVar11 = iVar14;
  } while (numInts * 4 - lVar12 != 0);
  ::std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  *local_78 = iVar14;
  pbVar2 = (byte *)(local_78 + 1);
  piVar13 = (int *)((long)local_78 + local_80 + 4);
  if (3 < numInts) {
    uVar7 = 0;
    do {
      iVar5 = 0;
      bVar10 = 0;
      uVar8 = uVar7;
      do {
        uVar7 = *ints;
        iVar11 = uVar7 - uVar8;
        if (iVar11 != iVar14) {
          bVar4 = (byte)iVar5;
          if ((char)iVar11 == iVar11) {
            bVar4 = (byte)(1 << (bVar4 & 0x1f));
            *(char *)piVar13 = (char)iVar11;
            lVar12 = 1;
          }
          else if ((short)iVar11 == iVar11) {
            bVar4 = (byte)(2 << (bVar4 & 0x1f));
            *(short *)piVar13 = (short)iVar11;
            lVar12 = 2;
          }
          else {
            bVar4 = (byte)(3 << (bVar4 & 0x1f));
            *piVar13 = iVar11;
            lVar12 = 4;
          }
          piVar13 = (int *)((long)piVar13 + lVar12);
          bVar10 = bVar10 | bVar4;
        }
        ints = ints + 1;
        iVar5 = iVar5 + 2;
        uVar8 = uVar7;
      } while (iVar5 != 8);
      *pbVar2 = bVar10;
      pbVar2 = pbVar2 + 1;
      numInts = numInts - 4;
    } while (3 < numInts);
  }
  sVar3 = (*(code *)(&DAT_005e5bdc + *(int *)(&DAT_005e5bdc + numInts * 4)))();
  return sVar3;
}

Assistant:

size_t
Usd_IntegerCompression::CompressToBuffer(
    uint32_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}